

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoins
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,Amount *target_value,vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos,
          UtxoFilter *filter,CoinSelectionOption *option_params,Amount *tx_fee_value,
          Amount *select_value,Amount *utxo_fee_value,bool *searched_bnb)

{
  Utxo *pUVar1;
  bool bVar2;
  int iVar3;
  CfdException *pCVar4;
  Utxo *utxo;
  pointer pUVar5;
  uint8_t *__s1;
  bool use_bnb_out;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> work_utxos;
  int64_t select_satoshi;
  Amount utxo_fee_out;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> p_utxos;
  Amount local_68;
  uint8_t src [33];
  
  __s1 = ((utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
          super__Vector_impl_data._M_start)->asset;
  pUVar1 = (utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar2 = true;
  do {
    if ((Utxo *)(__s1 + -0x89) == pUVar1) {
      if (select_value != (Amount *)0x0) {
        std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector(&work_utxos,utxos);
        p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::reserve
                  (&p_utxos,((long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)
                                  ._M_impl.super__Vector_impl_data._M_start) / 0xd8);
        for (pUVar5 = work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pUVar5 != (pointer)CONCAT44(work_utxos.
                                        super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                        work_utxos.
                                        super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._0_4_);
            pUVar5 = pUVar5 + 1) {
          utxo_fee_out.amount_ = (int64_t)pUVar5;
          std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::emplace_back<cfd::Utxo*>
                    ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)&p_utxos,
                     (Utxo **)&utxo_fee_out);
        }
        core::Amount::Amount(&utxo_fee_out);
        use_bnb_out = false;
        select_satoshi = 0;
        local_68.amount_ = core::Amount::GetSatoshiValue(target_value);
        SelectCoinsMinConf(__return_storage_ptr__,this,&local_68.amount_,&p_utxos,filter,
                           option_params,tx_fee_value,true,&select_satoshi,&utxo_fee_out,
                           &use_bnb_out);
        if (utxo_fee_value != (Amount *)0x0) {
          utxo_fee_value->ignore_check_ = utxo_fee_out.ignore_check_;
          utxo_fee_value->amount_ = utxo_fee_out.amount_;
        }
        if (searched_bnb != (bool *)0x0) {
          *searched_bnb = use_bnb_out;
        }
        core::Amount::Amount(&local_68,select_satoshi);
        select_value->ignore_check_ = local_68.ignore_check_;
        select_value->amount_ = local_68.amount_;
        std::_Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::~_Vector_base
                  (&p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>);
        std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                  (&work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
        return __return_storage_ptr__;
      }
      work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x4f88be;
      work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x112;
      work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_5de321;
      core::logger::warn<>
                ((CfdSourceLocation *)&work_utxos,"Outparameter(select_value) is nullptr.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&work_utxos,"Failed to select coin. Outparameter is nullptr.",
                 (allocator *)&p_utxos);
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&work_utxos);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (bVar2) {
      src[0x20] = __s1[0x20];
      src._0_8_ = *(undefined8 *)__s1;
      src._8_8_ = *(undefined8 *)(__s1 + 8);
      src._16_8_ = *(undefined8 *)(__s1 + 0x10);
      src._24_8_ = *(undefined8 *)(__s1 + 0x18);
    }
    else {
      iVar3 = bcmp(__s1,src,0x21);
      if (iVar3 != 0) {
        work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x4f88be;
        work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x109;
        work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_5de321;
        core::logger::warn<>
                  ((CfdSourceLocation *)&work_utxos,
                   "Failed to SelectCoins. Exists multiple assets in utxo list.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&work_utxos,
                   "Failed to SelectCoins. Exists multiple assets in utxo list.",
                   (allocator *)&p_utxos);
        core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&work_utxos);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
    }
    __s1 = __s1 + 0xd8;
    bVar2 = false;
  } while( true );
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoins(
    const Amount& target_value, const std::vector<Utxo>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, Amount* select_value, Amount* utxo_fee_value,
    bool* searched_bnb) {
#ifndef CFD_DISABLE_ELEMENTS
  bool first = true;
  uint8_t src[33];
  for (auto& utxo : utxos) {
    if (first) {
      memcpy(src, utxo.asset, sizeof(src));
      first = false;
    } else if (memcmp(utxo.asset, src, sizeof(src)) != 0) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to SelectCoins. Exists multiple assets in utxo list.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Exists multiple assets in utxo list.");
    }
  }
#endif
  if (select_value == nullptr) {
    warn(CFD_LOG_SOURCE, "Outparameter(select_value) is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to select coin. Outparameter is nullptr.");
  }

  // convert utxo list
  std::vector<Utxo> work_utxos = utxos;
  std::vector<Utxo*> p_utxos;
  p_utxos.reserve(utxos.size());
  for (auto& utxo : work_utxos) {
    p_utxos.push_back(&utxo);
  }

  // initialize output parameter
  Amount utxo_fee_out = Amount();
  bool use_bnb_out = false;
  const bool consider_fee = true;
  int64_t select_satoshi = 0;
  std::vector<Utxo> result = SelectCoinsMinConf(
      target_value.GetSatoshiValue(), p_utxos, filter, option_params,
      tx_fee_value, consider_fee, &select_satoshi, &utxo_fee_out,
      &use_bnb_out);
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = utxo_fee_out;
  }
  if (searched_bnb != nullptr) {
    *searched_bnb = use_bnb_out;
  }
  *select_value = Amount(select_satoshi);

  return result;
}